

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::docstring_comment
          (t_netstd_generator *this,ostream *out,string *comment_start,string *line_prefix,
          string *contents,string *comment_end)

{
  bool bVar1;
  ostream *poVar2;
  string local_5e0;
  stringstream docs;
  byte abStack_5a0 [360];
  char line [1024];
  
  bVar1 = std::operator!=(comment_start,"");
  if (bVar1) {
    t_generator::indent_abi_cxx11_((string *)line,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)line);
    std::operator<<(poVar2,(string *)comment_start);
    std::__cxx11::string::~string((string *)line);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&docs,(string *)contents,_S_in);
LAB_0025a367:
  while( true ) {
    if ((abStack_5a0[*(long *)(_docs + -0x18)] & 7) != 0) {
      bVar1 = std::operator!=(comment_end,"");
      if (bVar1) {
        t_generator::indent_abi_cxx11_((string *)line,(t_generator *)this);
        poVar2 = std::operator<<(out,(string *)line);
        std::operator<<(poVar2,(string *)comment_end);
        std::__cxx11::string::~string((string *)line);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&docs);
      return;
    }
    std::istream::getline((char *)&docs,(long)line);
    if (line[0] != '\0') break;
    bVar1 = std::operator==(line_prefix,"");
    if ((!bVar1) || ((abStack_5a0[*(long *)(_docs + -0x18)] & 2) != 0)) goto LAB_0025a3c9;
    std::operator<<(out,(string *)&::endl_abi_cxx11_);
  }
  goto LAB_0025a3e3;
LAB_0025a3c9:
  if ((line[0] != '\0') || ((abStack_5a0[*(long *)(_docs + -0x18)] & 2) == 0)) {
LAB_0025a3e3:
    t_generator::indent_abi_cxx11_(&local_5e0,(t_generator *)this);
    poVar2 = std::operator<<(out,(string *)&local_5e0);
    poVar2 = std::operator<<(poVar2,(string *)line_prefix);
    poVar2 = std::operator<<(poVar2,line);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_5e0);
  }
  goto LAB_0025a367;
}

Assistant:

void t_netstd_generator::docstring_comment(ostream& out, const string& comment_start, const string& line_prefix, const string& contents, const string& comment_end)
{
    if (comment_start != "")
    {
        out << indent() << comment_start;
    }

    stringstream docs(contents, std::ios_base::in);

    while (!(docs.eof() || docs.fail()))
    {
        char line[1024];
        docs.getline(line, 1024);

        // Just prnt a newline when the line & prefix are empty.
        if (strlen(line) == 0 && line_prefix == "" && !docs.eof())
        {
            out << endl;
        }
        else if (strlen(line) > 0 || !docs.eof())
        { // skip the empty last line
            out << indent() << line_prefix << line << endl;
        }
    }
    if (comment_end != "")
    {
        out << indent() << comment_end;
    }
}